

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emithelper.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseEmitHelper::emitArgsAssignment
          (BaseEmitHelper *this,FuncFrame *frame,FuncArgsAssignment *args)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  Error EVar9;
  uint32_t uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint regId;
  uint32_t uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  ArchTraits *this_00;
  ulong uVar21;
  ulong uVar22;
  uint regId_00;
  uint32_t *puVar23;
  ulong uVar24;
  long lStack_400;
  uint32_t local_3d8;
  uint local_3d4;
  long local_3d0;
  BaseReg dstReg;
  uint32_t local_380;
  uint local_37c;
  undefined4 local_378;
  undefined4 local_374;
  ulong local_370;
  RAConstraints constraints;
  FuncArgsContext ctx;
  
  bVar2 = frame->_arch;
  constraints._availableRegs[0] = 0;
  constraints._availableRegs[1] = 0;
  constraints._availableRegs[2] = 0;
  constraints._availableRegs[3] = 0;
  FuncArgsContext::FuncArgsContext(&ctx);
  EVar9 = RAConstraints::init(&constraints,(EVP_PKEY_CTX *)(ulong)bVar2);
  if ((EVar9 == 0) &&
     (EVar9 = FuncArgsContext::initWorkData(&ctx,frame,args,&constraints), EVar9 == 0)) {
    lVar20 = (ulong)(bVar2 & 0x7f) * 0xd4;
    this_00 = (ArchTraits *)(_archTraits + lVar20);
    uVar21 = (ulong)ctx._varCount;
    local_370 = (ulong)ctx._saVarId;
    bVar3 = this_00->_spRegId;
    regId = (uint)bVar3;
    if (frame->_minDynamicAlignment <= frame->_finalStackAlignment) {
      if ((frame->_attributes & 0x10) == 0) {
        if (ctx._saVarId < ctx._varCount) {
          regId = (uint)*(byte *)((long)&ctx._vars[local_370].cur._data + 2);
        }
        else {
          regId = (uint)frame->_saRegId;
        }
      }
      else {
        regId = (uint)(byte)_archTraits[lVar20 + 1];
      }
    }
    uVar6 = (this->_emitter->_gpRegInfo)._signature;
    if (ctx._stackDstMask != '\0') {
      uVar16 = frame->_dirtyRegs[(ulong)(regId != frame->_spRegId) - 3];
      uVar14 = (uVar6 & 0xf8) + 2;
      for (uVar22 = 0; uVar21 != uVar22; uVar22 = uVar22 + 1) {
        uVar13 = ctx._vars[uVar22].out._data;
        if ((uVar13 >> 9 & 1) != 0) {
          uVar11 = ctx._vars[uVar22].cur._data;
          if ((uVar11 & 0x300) == 0) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/emithelper.cpp"
                       ,0x94,"cur.isReg() || cur.isStack()");
          }
          dstReg.super_Operand.super_Operand_._signature = 1;
          dstReg.super_Operand.super_Operand_._baseId = 0xff;
          dstReg.super_Operand.super_Operand_._data[0] = 0;
          dstReg.super_Operand.super_Operand_._data[1] = 0;
          local_3d4 = (uint)bVar3;
          if ((uVar6 & 0xf8) == 0) {
            local_3d4 = ((int)uVar13 >> 0x1f) + (uint)bVar3;
          }
          local_3d0 = (ulong)(uint)((int)uVar13 >> 0xc) << 0x20;
          local_378 = 0;
          if ((uVar6 & 0xf8) == 0) {
            uVar17 = (long)((int)uVar11 >> 0xc) + CONCAT44(regId,uVar16);
            local_37c = (uint)(uVar17 >> 0x20);
          }
          else {
            uVar17 = (ulong)(((int)uVar11 >> 0xc) + uVar16);
            local_37c = regId;
          }
          local_374 = (undefined4)uVar17;
          local_3d8 = uVar14;
          local_380 = uVar14;
          if ((uVar11 >> 10 & 1) == 0) {
            if ((uVar11 >> 8 & 1) == 0) goto LAB_00112c5d;
            uVar10 = ArchTraits::regTypeToGroup(this_00,uVar11 >> 0x18);
            uVar13 = ctx._vars[uVar22].cur._data;
            uVar11 = uVar13 >> 0x10;
            uVar12 = ArchTraits::regTypeToSignature(this_00,uVar13 >> 0x18);
            dstReg.super_Operand.super_Operand_._0_8_ = CONCAT44(uVar11,uVar12) & 0xffffffffff;
            FuncArgsContext::WorkData::unassign
                      ((WorkData *)&ctx._workData[uVar10]._archRegs,(uint32_t)uVar22,uVar11 & 0xff);
          }
          else {
            if ((uVar11 >> 9 & 1) != 0) {
              return 0x1a;
            }
            local_37c = uVar11 >> 0x10 & 0xff;
LAB_00112c5d:
            uVar12 = Type::sizeOf(uVar13 & 0xff);
            uVar10 = Type::sizeOf(uVar11 & 0xff);
            if (uVar10 < uVar12) {
              uVar10 = uVar12;
            }
            if ((uint)((bVar2 & 1) == 0) * 4 + 4 < uVar10) {
              if (((uVar13 & 0xff) - 0x20 < 10) && ((uVar11 & 0xff) - 0x20 < 10)) {
LAB_00112cba:
                lStack_400 = 0x2c;
                goto LAB_00112cbd;
              }
              if (uVar10 < 9) {
                dstReg.super_Operand.super_Operand_._signature =
                     *(uint32_t *)(_archTraits + lVar20 + 0x3c);
                if (dstReg.super_Operand.super_Operand_._signature == 0) {
LAB_00112d9a:
                  dstReg.super_Operand.super_Operand_._signature =
                       *(uint32_t *)(_archTraits + lVar20 + 0x40);
                  if (dstReg.super_Operand.super_Operand_._signature == 0) goto LAB_00112db1;
                }
              }
              else {
                if (uVar10 < 0x11) goto LAB_00112d9a;
                if (0x20 < uVar10) {
                  lStack_400 = 0x48;
                  if (uVar10 < 0x41) goto LAB_00112cbd;
                  goto LAB_00112dd5;
                }
LAB_00112db1:
                dstReg.super_Operand.super_Operand_._signature =
                     *(uint32_t *)(_archTraits + lVar20 + 0x44);
                lStack_400 = 0x48;
                if (dstReg.super_Operand.super_Operand_._signature == 0) goto LAB_00112cbd;
              }
            }
            else {
              lStack_400 = 0x28;
              if (4 < uVar10) goto LAB_00112cba;
LAB_00112cbd:
              dstReg.super_Operand.super_Operand_._signature =
                   *(uint32_t *)(this_00->_reserved + lStack_400 + -4);
              if (dstReg.super_Operand.super_Operand_._signature == 0) goto LAB_00112dd5;
            }
            uVar17 = (ulong)(dstReg.super_Operand.super_Operand_._signature >> 2 & 0x3c0);
            uVar13 = ~*(uint *)(ctx._workData[0]._reserved + (uVar17 - 0xe)) &
                     *(uint *)(ctx._workData[0]._reserved + (uVar17 - 0x16));
            if (uVar13 == 0) goto LAB_00112dd5;
            dstReg.super_Operand.super_Operand_._baseId = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> dstReg.super_Operand.super_Operand_._baseId & 1) == 0;
                  dstReg.super_Operand.super_Operand_._baseId =
                       dstReg.super_Operand.super_Operand_._baseId + 1) {
              }
            }
            EVar9 = (*this->_vptr_BaseEmitHelper[2])
                              (this,&dstReg,(ulong)(byte)ctx._vars[uVar22].out._data,&local_380,
                               (ulong)(byte)ctx._vars[uVar22].cur._data);
            if (EVar9 != 0) {
              return EVar9;
            }
          }
          uVar13 = ctx._vars[uVar22].cur._data;
          if ((~uVar13 & 0x500) == 0) {
            FuncArgsContext::WorkData::unassign
                      (ctx._workData,(uint32_t)uVar22,uVar13 >> 0x10 & 0xff);
            uVar13 = (uint)(byte)ctx._vars[uVar22].cur._data;
          }
          EVar9 = (**this->_vptr_BaseEmitHelper)(this,&local_3d8,&dstReg,(ulong)(uVar13 & 0xff),0);
          if (EVar9 != 0) {
            return EVar9;
          }
          pbVar1 = (byte *)((long)&ctx._vars[uVar22].cur._data + 1);
          *pbVar1 = *pbVar1 | 8;
        }
      }
    }
    uVar22 = 0;
    uVar13 = 0;
    bVar7 = false;
LAB_00112de2:
    for (; uVar22 != uVar21; uVar22 = uVar22 + 1) {
      uVar11 = ctx._vars[uVar22].cur._data;
      if ((uVar11 & 0x900) == 0x100) {
        uVar14 = ArchTraits::regTypeToGroup(this_00,uVar11 >> 0x18);
        uVar16 = ArchTraits::regTypeToGroup
                           (this_00,(uint)*(byte *)((long)&ctx._vars[uVar22].out._data + 3));
        if (uVar14 != uVar16) {
          return 0x1a;
        }
        uVar11 = (uint)*(byte *)((long)&ctx._vars[uVar22].cur._data + 2);
        bVar2 = *(byte *)((long)&ctx._vars[uVar22].out._data + 2);
        uVar17 = (ulong)bVar2;
        uVar24 = (ulong)uVar14;
        puVar23 = &ctx._workData[uVar24]._archRegs;
        bVar8 = FuncArgsContext::WorkData::isAssigned((WorkData *)puVar23,(uint)bVar2);
        if (bVar8) {
          bVar3 = ctx._workData[uVar24]._physToVarId[uVar17];
          uVar15 = ctx._vars[bVar3].out._data;
          if ((uVar15 == 0) || (((uVar15 >> 8 & 1) != 0 && ((uVar15 >> 0x10 & 0xff) == uVar11)))) {
            if ((*(byte *)(lVar20 + 0x134010 + uVar24) & 1) != 0) {
              bVar4 = *(byte *)((long)&ctx._vars[uVar22].cur._data + 3);
              bVar5 = *(byte *)((long)&ctx._vars[bVar3].cur._data + 3);
              if (bVar4 <= bVar5) {
                bVar4 = bVar5;
              }
              uVar14 = 5;
              if (2 < bVar4 - 2) {
                uVar14 = (uint)bVar4;
              }
              local_3d8 = ArchTraits::regTypeToSignature(this_00,uVar14);
              dstReg.super_Operand.super_Operand_._baseId._0_1_ = bVar2;
              dstReg.super_Operand.super_Operand_._signature = local_3d8;
              dstReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
              dstReg.super_Operand.super_Operand_._data[0] = 0;
              dstReg.super_Operand.super_Operand_._data[1] = 0;
              local_3d0 = 0;
              local_3d4 = uVar11;
              EVar9 = (*this->_vptr_BaseEmitHelper[1])(this,&dstReg,&local_3d8,0);
              if (EVar9 != 0) {
                return EVar9;
              }
              FuncArgsContext::WorkData::swap
                        ((WorkData *)puVar23,(uint32_t)uVar22,uVar11,(uint)bVar3,(uint)bVar2);
              ctx._vars[uVar22].cur._data =
                   (ctx._vars[uVar22].cur._data & 0xff00f7ff) + (uint)bVar2 * 0x10000 + 0x800;
              uVar11 = ctx._vars[bVar3].cur._data & 0xff00ffff | uVar11 << 0x10;
              ctx._vars[bVar3].cur._data = uVar11;
              if (ctx._vars[bVar3].out._data != 0) {
                ctx._vars[bVar3].cur._data = uVar11 | 0x800;
              }
              uVar13 = uVar13 | 1;
              goto LAB_00112fbf;
            }
            uVar15 = ~ctx._workData[uVar24]._assignedRegs & ctx._workData[uVar24]._workRegs;
            if (uVar15 != 0) {
              uVar18 = ~ctx._workData[uVar24]._dstRegs & uVar15;
              if (uVar18 == 0) {
                uVar18 = uVar15;
              }
              uVar15 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar17 = (ulong)uVar15;
              goto LAB_00112eed;
            }
          }
          bVar7 = true;
        }
        else {
LAB_00112eed:
          dstReg.super_Operand.super_Operand_._signature =
               ArchTraits::regTypeToSignature
                         (this_00,(uint)*(byte *)((long)&ctx._vars[uVar22].out._data + 3));
          uVar16 = (uint32_t)uVar17;
          dstReg.super_Operand.super_Operand_._baseId = uVar16;
          dstReg.super_Operand.super_Operand_._data[0] = 0;
          dstReg.super_Operand.super_Operand_._data[1] = 0;
          uVar14 = ctx._vars[uVar22].out._data;
          local_3d8 = ArchTraits::regTypeToSignature
                                (this_00,(uint)*(byte *)((long)&ctx._vars[uVar22].cur._data + 3));
          local_3d0 = 0;
          local_3d4 = uVar11;
          EVar9 = (*this->_vptr_BaseEmitHelper[2])
                            (this,&dstReg,(ulong)(byte)uVar14,&local_3d8,
                             (ulong)(byte)ctx._vars[uVar22].cur._data,0);
          if (EVar9 != 0) {
            return EVar9;
          }
          FuncArgsContext::WorkData::reassign((WorkData *)puVar23,(uint32_t)uVar22,uVar16,uVar11);
          uVar11 = ctx._vars[uVar22].out._data;
          ctx._vars[uVar22].cur._data =
               (uint)(uVar16 == (uVar11 >> 0x10 & 0xff)) * 0x800 +
               (uVar11 & 0xff0000ff | uVar16 << 0x10) + 0x100;
          uVar13 = uVar13 | 3;
          bVar7 = true;
        }
      }
LAB_00112fbf:
    }
    if (!bVar7) {
      if (ctx._hasStackSrc != true) {
        return 0;
      }
      if ((frame->_minDynamicAlignment <= frame->_finalStackAlignment) &&
         ((frame->_attributes & 0x10) == 0)) {
        if ((uint)local_370 < ctx._varCount) {
          bVar2 = *(byte *)((long)&ctx._vars[local_370 & 0xffffffff].cur._data + 2);
        }
        else {
          bVar2 = frame->_saRegId;
        }
        regId = (uint)bVar2;
      }
      uVar14 = frame->_dirtyRegs[(ulong)(regId != frame->_spRegId) - 3];
      uVar13 = 1;
      uVar11 = 0;
      do {
        if (uVar13 <= uVar11) {
          return 0;
        }
        for (uVar22 = 0; uVar21 != uVar22; uVar22 = uVar22 + 1) {
          uVar15 = uVar13;
          if ((ctx._vars[uVar22].cur._data & 0xa00) == 0x200) {
            uVar18 = ctx._vars[uVar22].out._data;
            if ((uVar18 >> 8 & 1) == 0) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/emithelper.cpp"
                         ,0x13d,"var.out.isReg()");
            }
            regId_00 = uVar18 >> 0x10 & 0xff;
            uVar16 = ArchTraits::regTypeToGroup(this_00,uVar18 >> 0x18);
            puVar23 = &ctx._workData[uVar16]._archRegs;
            if ((regId_00 == regId) && (uVar16 == 0)) {
              uVar15 = 2;
              if (uVar13 == 1) goto LAB_001132b5;
              FuncArgsContext::WorkData::unassign
                        ((WorkData *)puVar23,(uint)ctx._workData[uVar16]._physToVarId[regId],regId);
            }
            uVar16 = ArchTraits::regTypeToSignature(this_00,uVar18 >> 0x18);
            dstReg.super_Operand.super_Operand_._0_8_ =
                 CONCAT44(uVar18 >> 0x10,uVar16) & 0xffffffffff;
            dstReg.super_Operand.super_Operand_._data[0] = 0;
            dstReg.super_Operand.super_Operand_._data[1] = 0;
            uVar15 = ctx._vars[uVar22].cur._data;
            iVar19 = (int)uVar15 >> 0xc;
            if ((uVar6 & 0xf8) == 0) {
              uVar17 = (long)iVar19 + CONCAT44(regId,uVar14);
              local_3d4 = (uint)(uVar17 >> 0x20);
            }
            else {
              uVar17 = (ulong)(iVar19 + uVar14);
              local_3d4 = regId;
            }
            local_3d0 = uVar17 << 0x20;
            local_3d8 = (uVar6 & 0xf8) + 2;
            EVar9 = (*this->_vptr_BaseEmitHelper[2])
                              (this,&dstReg,(ulong)(byte)ctx._vars[uVar22].out._data,&local_3d8,
                               (ulong)(uVar15 & 0xff),0);
            if (EVar9 != 0) {
              return EVar9;
            }
            FuncArgsContext::WorkData::assign((WorkData *)puVar23,(uint32_t)uVar22,regId_00);
            ctx._vars[uVar22].cur._data =
                 (uint)(byte)ctx._vars[uVar22].cur._data + (regId_00 << 0x10 | uVar18 & 0xff000000)
                 + 0x900;
            uVar15 = uVar13;
          }
LAB_001132b5:
          uVar13 = uVar15;
        }
        uVar11 = uVar11 + 1;
      } while( true );
    }
    if ((uVar13 & 5) != 4) {
      uVar13 = (~uVar13 & 1) << 2;
      bVar7 = false;
      uVar22 = 0;
      goto LAB_00112de2;
    }
LAB_00112dd5:
    EVar9 = 3;
  }
  return EVar9;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseEmitHelper::emitArgsAssignment(const FuncFrame& frame, const FuncArgsAssignment& args) {
  typedef FuncArgsContext::Var Var;
  typedef FuncArgsContext::WorkData WorkData;

  enum WorkFlags : uint32_t {
    kWorkNone      = 0x00,
    kWorkDidSome   = 0x01,
    kWorkPending   = 0x02,
    kWorkPostponed = 0x04
  };

  uint32_t arch = frame.arch();
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  RAConstraints constraints;
  FuncArgsContext ctx;

  ASMJIT_PROPAGATE(constraints.init(arch));
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, args, &constraints));

#ifdef ASMJIT_DUMP_ARGS_ASSIGNMENT
  {
    String sb;
    dumpAssignment(sb, ctx);
    printf("%s\n", sb.data());
  }
#endif

  uint32_t varCount = ctx._varCount;
  WorkData* workData = ctx._workData;

  uint32_t saVarId = ctx._saVarId;
  BaseReg sp = BaseReg::fromSignatureAndId(_emitter->_gpRegInfo.signature(), archTraits.spRegId());
  BaseReg sa = sp;

  if (frame.hasDynamicAlignment()) {
    if (frame.hasPreservedFP())
      sa.setId(archTraits.fpRegId());
    else
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());
  }

  // --------------------------------------------------------------------------
  // Register to stack and stack to stack moves must be first as now we have
  // the biggest chance of having as many as possible unassigned registers.
  // --------------------------------------------------------------------------

  if (ctx._stackDstMask) {
    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));
    BaseMem baseStackPtr(sp, 0);

    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];

      if (!var.out.isStack())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      ASMJIT_ASSERT(cur.isReg() || cur.isStack());
      BaseReg reg;

      BaseMem dstStackPtr = baseStackPtr.cloneAdjusted(out.stackOffset());
      BaseMem srcStackPtr = baseArgPtr.cloneAdjusted(cur.stackOffset());

      if (cur.isIndirect()) {
        if (cur.isStack()) {
          // TODO: Indirect stack.
          return DebugUtils::errored(kErrorInvalidAssignment);
        }
        else {
          srcStackPtr.setBaseId(cur.regId());
        }
      }

      if (cur.isReg() && !cur.isIndirect()) {
        WorkData& wd = workData[archTraits.regTypeToGroup(cur.regType())];
        uint32_t rId = cur.regId();

        reg.setSignatureAndId(archTraits.regTypeToSignature(cur.regType()), rId);
        wd.unassign(varId, rId);
      }
      else {
        // Stack to reg move - tricky since we move stack to stack we can decide which
        // register to use. In general we follow the rule that IntToInt moves will use
        // GP regs with possibility to signature or zero extend, and all other moves will
        // either use GP or VEC regs depending on the size of the move.
        RegInfo rInfo = getSuitableRegForMemToMemMove(arch, out.typeId(), cur.typeId());
        if (ASMJIT_UNLIKELY(!rInfo.isValid()))
          return DebugUtils::errored(kErrorInvalidState);

        WorkData& wd = workData[rInfo.group()];
        uint32_t availableRegs = wd.availableRegs();
        if (ASMJIT_UNLIKELY(!availableRegs))
          return DebugUtils::errored(kErrorInvalidState);

        uint32_t rId = Support::ctz(availableRegs);
        reg.setSignatureAndId(rInfo.signature(), rId);

        ASMJIT_PROPAGATE(emitArgMove(reg, out.typeId(), srcStackPtr, cur.typeId()));
      }

      if (cur.isIndirect() && cur.isReg())
        workData[BaseReg::kGroupGp].unassign(varId, cur.regId());

      // Register to stack move.
      ASMJIT_PROPAGATE(emitRegMove(dstStackPtr, reg, cur.typeId()));
      var.markDone();
    }
  }

  // --------------------------------------------------------------------------
  // Shuffle all registers that are currently assigned accordingly to target
  // assignment.
  // --------------------------------------------------------------------------

  uint32_t workFlags = kWorkNone;
  for (;;) {
    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];
      if (var.isDone() || !var.cur.isReg())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      uint32_t curGroup = archTraits.regTypeToGroup(cur.regType());
      uint32_t outGroup = archTraits.regTypeToGroup(out.regType());

      uint32_t curId = cur.regId();
      uint32_t outId = out.regId();

      if (curGroup != outGroup) {
        // TODO: Conversion is not supported.
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
      else {
        WorkData& wd = workData[outGroup];
        if (!wd.isAssigned(outId)) {
EmitMove:
          ASMJIT_PROPAGATE(
            emitArgMove(
              BaseReg::fromSignatureAndId(archTraits.regTypeToSignature(out.regType()), outId), out.typeId(),
              BaseReg::fromSignatureAndId(archTraits.regTypeToSignature(cur.regType()), curId), cur.typeId()));

          wd.reassign(varId, outId, curId);
          cur.initReg(out.regType(), outId, out.typeId());

          if (outId == out.regId())
            var.markDone();
          workFlags |= kWorkDidSome | kWorkPending;
        }
        else {
          uint32_t altId = wd._physToVarId[outId];
          Var& altVar = ctx._vars[altId];

          if (!altVar.out.isInitialized() || (altVar.out.isReg() && altVar.out.regId() == curId)) {
            // Only few architectures provide swap operations, and only for few register groups.
            if (archTraits.hasSwap(curGroup)) {
              uint32_t highestType = Support::max(cur.regType(), altVar.cur.regType());
              if (Support::isBetween<uint32_t>(highestType, BaseReg::kTypeGp8Lo, BaseReg::kTypeGp16))
                highestType = BaseReg::kTypeGp32;

              uint32_t signature = archTraits.regTypeToSignature(highestType);
              ASMJIT_PROPAGATE(
                emitRegSwap(BaseReg::fromSignatureAndId(signature, outId),
                            BaseReg::fromSignatureAndId(signature, curId)));
              wd.swap(varId, curId, altId, outId);
              cur.setRegId(outId);
              var.markDone();
              altVar.cur.setRegId(curId);

              if (altVar.out.isInitialized())
                altVar.markDone();
              workFlags |= kWorkDidSome;
            }
            else {
              // If there is a scratch register it can be used to perform the swap.
              uint32_t availableRegs = wd.availableRegs();
              if (availableRegs) {
                uint32_t inOutRegs = wd.dstRegs();
                if (availableRegs & ~inOutRegs)
                  availableRegs &= ~inOutRegs;
                outId = Support::ctz(availableRegs);
                goto EmitMove;
              }
              else {
                workFlags |= kWorkPending;
              }
            }
          }
          else {
            workFlags |= kWorkPending;
          }
        }
      }
    }

    if (!(workFlags & kWorkPending))
      break;

    // If we did nothing twice it means that something is really broken.
    if ((workFlags & (kWorkDidSome | kWorkPostponed)) == kWorkPostponed)
      return DebugUtils::errored(kErrorInvalidState);

    workFlags = (workFlags & kWorkDidSome) ? kWorkNone : kWorkPostponed;
  }

  // --------------------------------------------------------------------------
  // Load arguments passed by stack into registers. This is pretty simple and
  // it never requires multiple iterations like the previous phase.
  // --------------------------------------------------------------------------

  if (ctx._hasStackSrc) {
    uint32_t iterCount = 1;
    if (frame.hasDynamicAlignment() && !frame.hasPreservedFP())
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());

    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));

    for (uint32_t iter = 0; iter < iterCount; iter++) {
      for (uint32_t varId = 0; varId < varCount; varId++) {
        Var& var = ctx._vars[varId];
        if (var.isDone())
          continue;

        if (var.cur.isStack()) {
          ASMJIT_ASSERT(var.out.isReg());

          uint32_t outId = var.out.regId();
          uint32_t outType = var.out.regType();

          uint32_t group = archTraits.regTypeToGroup(outType);
          WorkData& wd = ctx._workData[group];

          if (outId == sa.id() && group == BaseReg::kGroupGp) {
            // This register will be processed last as we still need `saRegId`.
            if (iterCount == 1) {
              iterCount++;
              continue;
            }
            wd.unassign(wd._physToVarId[outId], outId);
          }

          BaseReg dstReg = BaseReg::fromSignatureAndId(archTraits.regTypeToSignature(outType), outId);
          BaseMem srcMem = baseArgPtr.cloneAdjusted(var.cur.stackOffset());

          ASMJIT_PROPAGATE(emitArgMove(
            dstReg, var.out.typeId(),
            srcMem, var.cur.typeId()));

          wd.assign(varId, outId);
          var.cur.initReg(outType, outId, var.cur.typeId(), FuncValue::kFlagIsDone);
        }
      }
    }
  }

  return kErrorOk;
}